

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O1

void __thiscall ON_DimStyle::SetMaskFillType(ON_DimStyle *this,MaskType source)

{
  undefined8 uVar1;
  MaskFrame MVar2;
  uchar uVar3;
  ON_Color OVar5;
  undefined4 uVar6;
  undefined1 uVar7;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined8 uVar14;
  ON_TextMask text_mask;
  ON_TextMask local_38;
  undefined5 uVar4;
  undefined4 uVar8;
  undefined3 uVar10;
  undefined2 uVar12;
  
  local_38.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  local_38.m_mask_type = (this->m_text_mask).m_mask_type;
  MVar2 = (this->m_text_mask).m_mask_frame;
  uVar3 = (this->m_text_mask).m_reserved2;
  OVar5.field_0 = (this->m_text_mask).m_mask_color.field_0;
  uVar4 = CONCAT41(OVar5.field_0,uVar3);
  local_38._2_6_ = CONCAT51(uVar4,MVar2);
  local_38.m_mask_border = (this->m_text_mask).m_mask_border;
  uVar6 = (this->m_text_mask).m_reserved3;
  uVar7 = (this->m_text_mask).m_content_hash.m_digest[0];
  uVar9 = (this->m_text_mask).m_content_hash.m_digest[1];
  uVar11 = (this->m_text_mask).m_content_hash.m_digest[2];
  uVar13 = (this->m_text_mask).m_content_hash.m_digest[3];
  uVar12 = CONCAT11(uVar13,uVar11);
  uVar10 = CONCAT21(uVar12,uVar9);
  uVar8 = CONCAT31(uVar10,uVar7);
  uVar14 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  uVar1 = *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  local_38.m_content_hash.m_digest._12_4_ = SUB84(uVar1,0);
  local_38.m_content_hash.m_digest._16_4_ = SUB84((ulong)uVar1 >> 0x20,0);
  local_38.m_content_hash.m_digest._4_4_ = SUB84(uVar14,0);
  local_38.m_content_hash.m_digest._8_4_ = SUB84((ulong)uVar14 >> 0x20,0);
  local_38.m_content_hash.m_digest._0_4_ = uVar8;
  if (local_38.m_mask_type != source) {
    local_38.m_mask_type = source;
    local_38.m_content_hash.m_digest._0_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._0_4_;
    local_38.m_content_hash.m_digest._4_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._4_4_;
    local_38.m_content_hash.m_digest._8_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._8_4_;
    local_38.m_content_hash.m_digest._12_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._12_4_;
    local_38.m_content_hash.m_digest._16_4_ = ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
  }
  local_38.m_reserved3 = uVar6;
  Internal_SetTextMask(this,&local_38);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskColorSource);
  return;
}

Assistant:

void ON_DimStyle::SetMaskFillType(ON_TextMask::MaskType source)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskFillType(source);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskColorSource);
}